

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# memory_file.cpp
# Opt level: O3

void __thiscall foxxll::memory_file::serve(memory_file *this)

{
  size_type in_RCX;
  offset_type in_RDX;
  void *in_RSI;
  read_or_write in_R8D;
  
  serve((memory_file *)
        ((long)&(this->super_disk_queued_file)._vptr_disk_queued_file +
        (long)(this->super_disk_queued_file)._vptr_disk_queued_file[-5]),in_RSI,in_RDX,in_RCX,in_R8D
       );
  return;
}

Assistant:

void memory_file::serve(void* buffer, offset_type offset, size_type bytes,
                        request::read_or_write op)
{
    std::unique_lock<std::mutex> lock(mutex_);

    if (op == request::READ)
    {
        file_stats::scoped_read_timer read_timer(file_stats_, bytes);
        memcpy(buffer, ptr_ + offset, bytes);
    }
    else
    {
        file_stats::scoped_write_timer write_timer(file_stats_, bytes);
        memcpy(ptr_ + offset, buffer, bytes);
    }
}